

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O0

CURLcode connect_SOCKS(Curl_cfilter *cf,socks_state *sxstate,Curl_easy *data)

{
  connectdata *conn;
  CURLproxycode pxresult;
  CURLcode result;
  Curl_easy *data_local;
  socks_state *sxstate_local;
  Curl_cfilter *cf_local;
  
  conn._4_4_ = CURLE_OK;
  conn._0_4_ = CURLPX_OK;
  switch((cf->conn->socks_proxy).proxytype) {
  case '\x04':
  case '\x06':
    conn._0_4_ = do_SOCKS4(cf,sxstate,data);
    break;
  case '\x05':
  case '\a':
    conn._0_4_ = do_SOCKS5(cf,sxstate,data);
    break;
  default:
    Curl_failf(data,"unknown proxytype option given");
    conn._4_4_ = CURLE_COULDNT_CONNECT;
  }
  if ((CURLproxycode)conn != CURLPX_OK) {
    conn._4_4_ = CURLE_PROXY;
    (data->info).pxcode = (CURLproxycode)conn;
  }
  return conn._4_4_;
}

Assistant:

static CURLcode connect_SOCKS(struct Curl_cfilter *cf,
                              struct socks_state *sxstate,
                              struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  CURLproxycode pxresult = CURLPX_OK;
  struct connectdata *conn = cf->conn;

  switch(conn->socks_proxy.proxytype) {
  case CURLPROXY_SOCKS5:
  case CURLPROXY_SOCKS5_HOSTNAME:
    pxresult = do_SOCKS5(cf, sxstate, data);
    break;

  case CURLPROXY_SOCKS4:
  case CURLPROXY_SOCKS4A:
    pxresult = do_SOCKS4(cf, sxstate, data);
    break;

  default:
    failf(data, "unknown proxytype option given");
    result = CURLE_COULDNT_CONNECT;
  } /* switch proxytype */
  if(pxresult) {
    result = CURLE_PROXY;
    data->info.pxcode = pxresult;
  }

  return result;
}